

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

NondegeneracyCheckResult * __thiscall
slang::ast::SimpleAssertionExpr::checkNondegeneracyImpl(SimpleAssertionExpr *this)

{
  bool bVar1;
  NondegeneracyCheckResult *in_RSI;
  NondegeneracyCheckResult *in_RDI;
  SourceRange SVar2;
  AssertionInstanceExpression *aie;
  NondegeneracyCheckResult *rhs;
  SequenceRepetition *in_stack_ffffffffffffffa0;
  SyntaxNode *in_stack_ffffffffffffffd0;
  SourceLocation local_20;
  SourceLocation local_18;
  bitmask<slang::ast::NondegeneracyStatus> local_c [3];
  
  rhs = in_RDI;
  AssertionExpr::NondegeneracyCheckResult::NondegeneracyCheckResult(in_RDI);
  if ((in_RSI[1].noMatchRange.startLoc.field_0x4 & 1) != 0) {
    bitmask<slang::ast::NondegeneracyStatus>::bitmask(local_c,AdmitsNoMatch);
    bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,local_c);
    if ((in_RSI->noMatchRange).startLoc != (SourceLocation)0x0) {
      SVar2 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffffd0);
      local_20 = SVar2.startLoc;
      (in_RDI->noMatchRange).startLoc = local_20;
      local_18 = SVar2.endLoc;
      (in_RDI->noMatchRange).endLoc = local_18;
      in_RDI->isAlwaysFalse = true;
    }
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRepetition> *)0x9d1699)
  ;
  if (bVar1) {
    std::optional<slang::ast::SequenceRepetition>::operator->
              ((optional<slang::ast::SequenceRepetition> *)0x9d16ad);
    SequenceRepetition::checkNondegeneracy(in_stack_ffffffffffffffa0);
    AssertionExpr::NondegeneracyCheckResult::operator|=(in_RSI,rhs);
  }
  if (*(int *)(in_RSI->noMatchRange).endLoc == 0x27) {
    Expression::as<slang::ast::AssertionInstanceExpression>
              ((Expression *)(in_RSI->noMatchRange).endLoc);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9d16f8);
    bVar1 = Type::isSequenceType((Type *)0x9d1700);
    if (bVar1) {
      AssertionExpr::checkNondegeneracy((AssertionExpr *)in_RDI);
      AssertionExpr::NondegeneracyCheckResult::operator|=(in_RSI,rhs);
    }
  }
  return rhs;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult SimpleAssertionExpr::checkNondegeneracyImpl() const {
    // If simple sequence expression can be evaluated to false
    // then it admits no possible match.
    NondegeneracyCheckResult result;
    if (isNullExpr) {
        result.status |= NondegeneracyStatus::AdmitsNoMatch;
        if (syntax) {
            result.noMatchRange = syntax->sourceRange();
            result.isAlwaysFalse = true;
        }
    }

    if (repetition)
        result |= repetition->checkNondegeneracy();

    if (expr.kind == ExpressionKind::AssertionInstance) {
        auto& aie = expr.as<AssertionInstanceExpression>();
        if (aie.type->isSequenceType())
            result |= aie.body.checkNondegeneracy();
    }
    return result;
}